

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *iEnd;
  BYTE *pBVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  BYTE *pBVar6;
  ZSTD_matchState_t *pZVar7;
  ulong *mEnd;
  BYTE *pBVar8;
  U32 *pUVar9;
  U32 *pUVar10;
  seqDef *psVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  undefined8 uVar15;
  char cVar16;
  uint uVar17;
  ulong *puVar18;
  size_t sVar19;
  ulong *puVar20;
  BYTE *pBVar21;
  byte bVar22;
  byte bVar23;
  int iVar24;
  U32 UVar25;
  ulong *puVar26;
  uint uVar27;
  long lVar28;
  char *_ptr;
  U32 UVar29;
  BYTE *litEnd_3;
  uint uVar30;
  U32 UVar31;
  ulong *puVar32;
  int *piVar33;
  ulong uVar34;
  BYTE *iStart;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  uint uVar38;
  BYTE *litEnd_1;
  ulong *puVar39;
  ulong *puVar40;
  ulong uVar41;
  BYTE *pBVar42;
  BYTE *pBVar43;
  ulong uVar44;
  bool bVar45;
  U32 dictIndexDelta;
  BYTE *iend;
  U32 prefixStartIndex;
  BYTE *base;
  U32 *hashTable;
  BYTE *prefixStart;
  BYTE *ilimit;
  BYTE *litLimit_w;
  BYTE *litLimit_w_4;
  BYTE *dictEnd;
  BYTE *dictBase;
  U32 stepSize;
  BYTE *dictStart;
  U32 dictStartIndex;
  uint local_144;
  U32 local_134;
  ulong local_d0;
  ulong *local_a8;
  ulong *local_a0;
  ulong local_90;
  
  uVar4 = (ms->cParams).targetLength;
  uVar36 = (ulong)(uVar4 + (uVar4 == 0));
  pBVar6 = (ms->window).base;
  uVar4 = (ms->window).dictLimit;
  iStart = pBVar6 + uVar4;
  iEnd = (ulong *)((long)src + srcSize);
  puVar18 = (ulong *)((long)src + (srcSize - 8));
  pZVar7 = ms->dictMatchState;
  uVar5 = (pZVar7->window).dictLimit;
  mEnd = (ulong *)(pZVar7->window).nextSrc;
  pBVar8 = (pZVar7->window).base;
  pBVar42 = pBVar8 + uVar5;
  uVar30 = ((int)pBVar8 - (int)mEnd) + uVar4;
  iVar13 = ((int)src - (int)iStart) + (int)mEnd;
  iVar14 = (int)pBVar42;
  pUVar9 = pZVar7->hashTable;
  uVar17 = (pZVar7->cParams).hashLog;
  uVar27 = (ms->cParams).minMatch;
  pUVar10 = ms->hashTable;
  iVar24 = ms->prefetchCDictTables;
  puVar20 = (ulong *)((long)src + uVar36);
  UVar31 = *rep;
  UVar25 = rep[1];
  bVar22 = (byte)uVar17;
  iVar37 = (int)pBVar6;
  cVar16 = (char)(ms->cParams).hashLog;
  if (uVar27 == 5) {
    if ((iVar24 != 0) && (uVar17 < 0x3e)) {
      uVar34 = 0;
      do {
        uVar34 = uVar34 + 0x40;
      } while (uVar34 < (ulong)(4L << (bVar22 & 0x3f)));
    }
    puVar39 = (ulong *)((long)src + (ulong)(iVar13 == iVar14));
    bVar23 = 0x40 - cVar16;
    puVar1 = iEnd + -4;
    pBVar43 = pBVar42;
    do {
      if (puVar18 < puVar20) break;
      local_90 = *puVar39 * -0x30e4432345000000 >> (bVar23 & 0x3f);
      uVar34 = *puVar39 * -0x30e4432345000000 >> (0x38 - bVar22 & 0x3f);
      uVar17 = pUVar9[uVar34 >> 8];
      bVar45 = (char)uVar17 == (char)uVar34;
      local_144 = pUVar10[local_90];
      local_134 = (int)puVar39 - iVar37;
      local_a0 = puVar39 + 0x20;
      puVar26 = puVar20;
      puVar40 = puVar39;
      local_a8 = (ulong *)uVar36;
      do {
        uVar27 = (local_134 - UVar31) + 1;
        piVar33 = (int *)(pBVar6 + uVar27);
        if (uVar27 < uVar4) {
          piVar33 = (int *)(pBVar8 + (uVar27 - uVar30));
        }
        uVar34 = *puVar26 * -0x30e4432345000000 >> (bVar23 & 0x3f);
        uVar44 = *puVar26 * -0x30e4432345000000 >> (0x38 - bVar22 & 0x3f);
        pUVar10[local_90] = local_134;
        puVar20 = puVar26;
        if (((uVar4 - 1) - uVar27 < 3) || (*piVar33 != *(int *)((long)puVar40 + 1))) {
          if (bVar45) {
            uVar27 = uVar17 >> 8;
            iVar24 = 0;
            bVar12 = true;
            puVar39 = puVar40;
            if (((uVar5 < uVar27) && (*(int *)(pBVar8 + uVar27) == (int)*puVar40)) &&
               (local_144 <= uVar4)) {
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar40 + 4),(BYTE *)((long)(pBVar8 + uVar27) + 4),
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              pBVar43 = (BYTE *)(sVar19 + 4);
              if (src < puVar40) {
                pBVar21 = pBVar8 + ((ulong)uVar27 - 1);
                do {
                  puVar39 = (ulong *)((long)puVar40 + -1);
                  if ((*(BYTE *)puVar39 != *pBVar21) ||
                     (pBVar43 = pBVar43 + 1, puVar40 = puVar39, puVar39 <= src)) break;
                  bVar12 = pBVar42 < pBVar21;
                  pBVar21 = pBVar21 + -1;
                } while (bVar12);
              }
              uVar41 = (long)puVar40 - (long)src;
              puVar39 = (ulong *)seqStore->lit;
              if (puVar1 < puVar40) {
                ZSTD_safecopyLiterals((BYTE *)puVar39,(BYTE *)src,(BYTE *)puVar40,(BYTE *)puVar1);
              }
              else {
                uVar35 = *(ulong *)((long)src + 8);
                *puVar39 = *src;
                puVar39[1] = uVar35;
                if (0x10 < uVar41) {
                  pBVar21 = seqStore->lit;
                  uVar35 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar21 + 0x18) = uVar35;
                  if (0x20 < (long)uVar41) {
                    lVar28 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
                      uVar15 = puVar3[1];
                      pBVar2 = pBVar21 + lVar28 + 0x20;
                      *(undefined8 *)pBVar2 = *puVar3;
                      *(undefined8 *)(pBVar2 + 8) = uVar15;
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
                      uVar15 = puVar3[1];
                      *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                      lVar28 = lVar28 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar41);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar41;
              if (0xffff < uVar41) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              UVar29 = local_134 - (uVar27 + uVar30);
              psVar11 = seqStore->sequences;
              psVar11->litLength = (U16)uVar41;
              psVar11->offBase = UVar29 + 3;
              if ((BYTE *)0xffff < pBVar43 + -3) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar11->mlBase = (U16)(pBVar43 + -3);
              seqStore->sequences = psVar11 + 1;
              iVar24 = 0xc;
              bVar12 = false;
              puVar39 = puVar40;
              UVar25 = UVar31;
              UVar31 = UVar29;
            }
            puVar40 = puVar39;
            UVar29 = UVar31;
            if (!bVar12) goto LAB_003ac7ad;
          }
          if (uVar4 < local_144) {
            piVar33 = (int *)(pBVar6 + local_144);
            if (*piVar33 == (int)*puVar40) {
              puVar39 = (ulong *)((long)puVar40 + 4);
              puVar32 = (ulong *)(piVar33 + 1);
              puVar26 = puVar39;
              if (puVar39 < (ulong *)((long)iEnd + -7)) {
                uVar44 = *puVar39 ^ *puVar32;
                uVar34 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                pBVar43 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                if (*puVar32 == *puVar39) {
                  puVar26 = (ulong *)((long)puVar40 + 0xc);
                  puVar32 = (ulong *)(piVar33 + 3);
                  do {
                    if ((ulong *)((long)iEnd + -7) <= puVar26) goto LAB_003ac616;
                    uVar34 = *puVar32;
                    uVar44 = *puVar26;
                    uVar35 = uVar44 ^ uVar34;
                    uVar41 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                      }
                    }
                    pBVar43 = (BYTE *)((long)puVar26 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar39))
                    ;
                    puVar26 = puVar26 + 1;
                    puVar32 = puVar32 + 1;
                  } while (uVar34 == uVar44);
                }
              }
              else {
LAB_003ac616:
                if ((puVar26 < (ulong *)((long)iEnd + -3)) && ((int)*puVar32 == (int)*puVar26)) {
                  puVar26 = (ulong *)((long)puVar26 + 4);
                  puVar32 = (ulong *)((long)puVar32 + 4);
                }
                if ((puVar26 < (ulong *)((long)iEnd + -1)) && ((short)*puVar32 == (short)*puVar26))
                {
                  puVar26 = (ulong *)((long)puVar26 + 2);
                  puVar32 = (ulong *)((long)puVar32 + 2);
                }
                if (puVar26 < iEnd) {
                  puVar26 = (ulong *)((long)puVar26 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar26));
                }
                pBVar43 = (BYTE *)((long)puVar26 - (long)puVar39);
              }
              pBVar43 = pBVar43 + 4;
              puVar39 = puVar40;
              if (src < puVar40) {
                pBVar21 = pBVar6 + ((ulong)local_144 - 1);
                do {
                  puVar26 = (ulong *)((long)puVar39 + -1);
                  if ((*(BYTE *)puVar26 != *pBVar21) ||
                     (pBVar43 = pBVar43 + 1, puVar39 = puVar26, puVar26 <= src)) break;
                  bVar12 = iStart < pBVar21;
                  pBVar21 = pBVar21 + -1;
                } while (bVar12);
              }
              uVar34 = (long)puVar39 - (long)src;
              puVar26 = (ulong *)seqStore->lit;
              if (puVar1 < puVar39) {
                ZSTD_safecopyLiterals((BYTE *)puVar26,(BYTE *)src,(BYTE *)puVar39,(BYTE *)puVar1);
              }
              else {
                uVar44 = *(ulong *)((long)src + 8);
                *puVar26 = *src;
                puVar26[1] = uVar44;
                if (0x10 < uVar34) {
                  pBVar21 = seqStore->lit;
                  uVar44 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar21 + 0x18) = uVar44;
                  if (0x20 < (long)uVar34) {
                    lVar28 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
                      uVar15 = puVar3[1];
                      pBVar2 = pBVar21 + lVar28 + 0x20;
                      *(undefined8 *)pBVar2 = *puVar3;
                      *(undefined8 *)(pBVar2 + 8) = uVar15;
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
                      uVar15 = puVar3[1];
                      *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                      lVar28 = lVar28 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar34);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar34;
              if (0xffff < uVar34) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              UVar29 = (int)puVar40 - (int)piVar33;
              psVar11 = seqStore->sequences;
              psVar11->litLength = (U16)uVar34;
              psVar11->offBase = UVar29 + 3;
              if ((BYTE *)0xffff < pBVar43 + -3) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar11->mlBase = (U16)(pBVar43 + -3);
              seqStore->sequences = psVar11 + 1;
              iVar24 = 0xc;
              UVar25 = UVar31;
              goto LAB_003ac7ad;
            }
          }
          uVar17 = pUVar9[uVar44 >> 8];
          bVar45 = (char)uVar44 == (char)uVar17;
          local_144 = pUVar10[uVar34];
          local_a8 = (ulong *)((long)local_a8 + (ulong)(local_a0 <= puVar26));
          local_a0 = local_a0 + (ulong)(local_a0 <= puVar26) * 0x20;
          puVar20 = (ulong *)((long)puVar26 + (long)local_a8);
          iVar24 = 0x11;
          puVar39 = puVar26;
          UVar29 = UVar31;
          if (puVar20 <= puVar18) {
            local_134 = (int)puVar26 - iVar37;
            iVar24 = 0;
            local_90 = uVar34;
          }
        }
        else {
          puVar39 = (ulong *)((long)puVar40 + 1);
          puVar26 = iEnd;
          if (uVar27 < uVar4) {
            puVar26 = mEnd;
          }
          sVar19 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar40 + 5),(BYTE *)(piVar33 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar26,iStart);
          uVar34 = (long)puVar39 - (long)src;
          puVar26 = (ulong *)seqStore->lit;
          if (puVar1 < puVar39) {
            ZSTD_safecopyLiterals((BYTE *)puVar26,(BYTE *)src,(BYTE *)puVar39,(BYTE *)puVar1);
          }
          else {
            uVar44 = *(ulong *)((long)src + 8);
            *puVar26 = *src;
            puVar26[1] = uVar44;
            if (0x10 < uVar34) {
              pBVar43 = seqStore->lit;
              uVar44 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar43 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar43 + 0x18) = uVar44;
              if (0x20 < (long)uVar34) {
                lVar28 = 0;
                do {
                  puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
                  uVar15 = puVar3[1];
                  pBVar21 = pBVar43 + lVar28 + 0x20;
                  *(undefined8 *)pBVar21 = *puVar3;
                  *(undefined8 *)(pBVar21 + 8) = uVar15;
                  puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
                  uVar15 = puVar3[1];
                  *(undefined8 *)(pBVar21 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar21 + 0x18) = uVar15;
                  lVar28 = lVar28 + 0x20;
                } while (pBVar21 + 0x20 < pBVar43 + uVar34);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar34;
          if (0xffff < uVar34) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          psVar11 = seqStore->sequences;
          psVar11->litLength = (U16)uVar34;
          psVar11->offBase = 1;
          if (0xffff < sVar19 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
          }
          pBVar43 = (BYTE *)(sVar19 + 4);
          psVar11->mlBase = (U16)(sVar19 + 1);
          seqStore->sequences = psVar11 + 1;
          iVar24 = 0xc;
          UVar29 = UVar31;
        }
LAB_003ac7ad:
        UVar31 = UVar29;
        puVar26 = puVar20;
        puVar40 = puVar39;
      } while (iVar24 == 0);
      if (iVar24 == 0xc) {
        puVar39 = (ulong *)((long)puVar39 + (long)pBVar43);
        if (puVar39 <= puVar18) {
          pUVar10[(ulong)(*(long *)(pBVar6 + (ulong)local_134 + 2) * -0x30e4432345000000) >>
                  (bVar23 & 0x3f)] = local_134 + 2;
          pUVar10[(ulong)(*(long *)((long)puVar39 + -2) * -0x30e4432345000000) >> (bVar23 & 0x3f)] =
               ((int)puVar39 + -2) - iVar37;
          do {
            if (puVar18 < puVar39) break;
            UVar29 = (int)puVar39 - iVar37;
            uVar17 = UVar29 - UVar25;
            pBVar21 = pBVar6;
            if (uVar17 < uVar4) {
              pBVar21 = pBVar8 + -(ulong)uVar30;
            }
            if (((uVar4 - 1) - uVar17 < 3) || (*(int *)(pBVar21 + uVar17) != (int)*puVar39)) {
              bVar45 = false;
              UVar29 = UVar25;
            }
            else {
              puVar20 = iEnd;
              if (uVar17 < uVar4) {
                puVar20 = mEnd;
              }
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar39 + 4),(BYTE *)((long)(pBVar21 + uVar17) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar20,iStart);
              puVar20 = (ulong *)seqStore->lit;
              if (puVar1 < puVar39) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar20,(BYTE *)puVar39,(BYTE *)puVar39,(BYTE *)puVar1);
              }
              else {
                uVar34 = puVar39[1];
                *puVar20 = *puVar39;
                puVar20[1] = uVar34;
              }
              psVar11 = seqStore->sequences;
              psVar11->litLength = 0;
              psVar11->offBase = 1;
              if (0xffff < sVar19 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar11->mlBase = (U16)(sVar19 + 1);
              seqStore->sequences = psVar11 + 1;
              pUVar10[*puVar39 * -0x30e4432345000000 >> (bVar23 & 0x3f)] = UVar29;
              puVar39 = (ulong *)((long)puVar39 + sVar19 + 4);
              bVar45 = true;
              UVar29 = UVar31;
              UVar31 = UVar25;
            }
            UVar25 = UVar29;
          } while (bVar45);
        }
        puVar20 = (ulong *)(uVar36 + (long)puVar39);
        bVar45 = true;
        src = puVar39;
      }
      else {
        bVar45 = false;
      }
    } while (bVar45);
  }
  else if (uVar27 == 6) {
    if ((iVar24 != 0) && (uVar17 < 0x3e)) {
      uVar34 = 0;
      do {
        uVar34 = uVar34 + 0x40;
      } while (uVar34 < (ulong)(4L << (bVar22 & 0x3f)));
    }
    puVar39 = (ulong *)((long)src + (ulong)(iVar13 == iVar14));
    bVar23 = 0x40 - cVar16;
    puVar1 = iEnd + -4;
    pBVar43 = pBVar42;
    do {
      if (puVar18 < puVar20) break;
      local_90 = *puVar39 * -0x30e4432340650000 >> (bVar23 & 0x3f);
      uVar34 = *puVar39 * -0x30e4432340650000 >> (0x38 - bVar22 & 0x3f);
      uVar17 = pUVar9[uVar34 >> 8];
      bVar45 = (char)uVar17 == (char)uVar34;
      local_144 = pUVar10[local_90];
      local_134 = (int)puVar39 - iVar37;
      local_a8 = puVar39 + 0x20;
      puVar26 = puVar20;
      local_d0 = uVar36;
      do {
        uVar27 = (local_134 - UVar31) + 1;
        piVar33 = (int *)(pBVar6 + uVar27);
        if (uVar27 < uVar4) {
          piVar33 = (int *)(pBVar8 + (uVar27 - uVar30));
        }
        uVar34 = *puVar26 * -0x30e4432340650000 >> (bVar23 & 0x3f);
        uVar44 = *puVar26 * -0x30e4432340650000 >> (0x38 - bVar22 & 0x3f);
        pUVar10[local_90] = local_134;
        puVar20 = puVar26;
        if (((uVar4 - 1) - uVar27 < 3) || (*piVar33 != *(int *)((long)puVar39 + 1))) {
          if (bVar45) {
            uVar27 = uVar17 >> 8;
            iVar24 = 0;
            bVar12 = true;
            if (((uVar5 < uVar27) && (*(int *)(pBVar8 + uVar27) == (int)*puVar39)) &&
               (local_144 <= uVar4)) {
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar39 + 4),(BYTE *)((long)(pBVar8 + uVar27) + 4),
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              pBVar43 = (BYTE *)(sVar19 + 4);
              if (src < puVar39) {
                pBVar21 = pBVar8 + ((ulong)uVar27 - 1);
                do {
                  puVar40 = (ulong *)((long)puVar39 + -1);
                  if ((*(BYTE *)puVar40 != *pBVar21) ||
                     (pBVar43 = pBVar43 + 1, puVar39 = puVar40, puVar40 <= src)) break;
                  bVar12 = pBVar42 < pBVar21;
                  pBVar21 = pBVar21 + -1;
                } while (bVar12);
              }
              uVar41 = (long)puVar39 - (long)src;
              puVar40 = (ulong *)seqStore->lit;
              if (puVar1 < puVar39) {
                ZSTD_safecopyLiterals((BYTE *)puVar40,(BYTE *)src,(BYTE *)puVar39,(BYTE *)puVar1);
              }
              else {
                uVar35 = *(ulong *)((long)src + 8);
                *puVar40 = *src;
                puVar40[1] = uVar35;
                if (0x10 < uVar41) {
                  pBVar21 = seqStore->lit;
                  uVar35 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar21 + 0x18) = uVar35;
                  if (0x20 < (long)uVar41) {
                    lVar28 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
                      uVar15 = puVar3[1];
                      pBVar2 = pBVar21 + lVar28 + 0x20;
                      *(undefined8 *)pBVar2 = *puVar3;
                      *(undefined8 *)(pBVar2 + 8) = uVar15;
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
                      uVar15 = puVar3[1];
                      *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                      lVar28 = lVar28 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar41);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar41;
              if (0xffff < uVar41) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              UVar29 = local_134 - (uVar27 + uVar30);
              psVar11 = seqStore->sequences;
              psVar11->litLength = (U16)uVar41;
              psVar11->offBase = UVar29 + 3;
              if ((BYTE *)0xffff < pBVar43 + -3) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar11->mlBase = (U16)(pBVar43 + -3);
              seqStore->sequences = psVar11 + 1;
              iVar24 = 0xc;
              bVar12 = false;
              UVar25 = UVar31;
              UVar31 = UVar29;
            }
            UVar29 = UVar31;
            if (!bVar12) goto LAB_003abe01;
          }
          if (uVar4 < local_144) {
            piVar33 = (int *)(pBVar6 + local_144);
            if (*piVar33 == (int)*puVar39) {
              puVar26 = (ulong *)((long)puVar39 + 4);
              puVar32 = (ulong *)(piVar33 + 1);
              puVar40 = puVar26;
              if (puVar26 < (ulong *)((long)iEnd + -7)) {
                uVar44 = *puVar26 ^ *puVar32;
                uVar34 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                pBVar43 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                if (*puVar32 == *puVar26) {
                  puVar40 = (ulong *)((long)puVar39 + 0xc);
                  puVar32 = (ulong *)(piVar33 + 3);
                  do {
                    if ((ulong *)((long)iEnd + -7) <= puVar40) goto LAB_003abc67;
                    uVar34 = *puVar32;
                    uVar44 = *puVar40;
                    uVar35 = uVar44 ^ uVar34;
                    uVar41 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                      }
                    }
                    pBVar43 = (BYTE *)((long)puVar40 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar26))
                    ;
                    puVar40 = puVar40 + 1;
                    puVar32 = puVar32 + 1;
                  } while (uVar34 == uVar44);
                }
              }
              else {
LAB_003abc67:
                if ((puVar40 < (ulong *)((long)iEnd + -3)) && ((int)*puVar32 == (int)*puVar40)) {
                  puVar40 = (ulong *)((long)puVar40 + 4);
                  puVar32 = (ulong *)((long)puVar32 + 4);
                }
                if ((puVar40 < (ulong *)((long)iEnd + -1)) && ((short)*puVar32 == (short)*puVar40))
                {
                  puVar40 = (ulong *)((long)puVar40 + 2);
                  puVar32 = (ulong *)((long)puVar32 + 2);
                }
                if (puVar40 < iEnd) {
                  puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar40));
                }
                pBVar43 = (BYTE *)((long)puVar40 - (long)puVar26);
              }
              pBVar43 = pBVar43 + 4;
              puVar26 = puVar39;
              if (src < puVar39) {
                pBVar21 = pBVar6 + ((ulong)local_144 - 1);
                do {
                  puVar40 = (ulong *)((long)puVar26 + -1);
                  if ((*(BYTE *)puVar40 != *pBVar21) ||
                     (pBVar43 = pBVar43 + 1, puVar26 = puVar40, puVar40 <= src)) break;
                  bVar12 = iStart < pBVar21;
                  pBVar21 = pBVar21 + -1;
                } while (bVar12);
              }
              uVar34 = (long)puVar26 - (long)src;
              puVar40 = (ulong *)seqStore->lit;
              if (puVar1 < puVar26) {
                ZSTD_safecopyLiterals((BYTE *)puVar40,(BYTE *)src,(BYTE *)puVar26,(BYTE *)puVar1);
              }
              else {
                uVar44 = *(ulong *)((long)src + 8);
                *puVar40 = *src;
                puVar40[1] = uVar44;
                if (0x10 < uVar34) {
                  pBVar21 = seqStore->lit;
                  uVar44 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar21 + 0x18) = uVar44;
                  if (0x20 < (long)uVar34) {
                    lVar28 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
                      uVar15 = puVar3[1];
                      pBVar2 = pBVar21 + lVar28 + 0x20;
                      *(undefined8 *)pBVar2 = *puVar3;
                      *(undefined8 *)(pBVar2 + 8) = uVar15;
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
                      uVar15 = puVar3[1];
                      *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                      lVar28 = lVar28 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar34);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar34;
              if (0xffff < uVar34) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              UVar29 = (int)puVar39 - (int)piVar33;
              psVar11 = seqStore->sequences;
              psVar11->litLength = (U16)uVar34;
              psVar11->offBase = UVar29 + 3;
              if ((BYTE *)0xffff < pBVar43 + -3) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar11->mlBase = (U16)(pBVar43 + -3);
              seqStore->sequences = psVar11 + 1;
              iVar24 = 0xc;
              puVar39 = puVar26;
              UVar25 = UVar31;
              goto LAB_003abe01;
            }
          }
          uVar17 = pUVar9[uVar44 >> 8];
          bVar45 = (char)uVar44 == (char)uVar17;
          local_144 = pUVar10[uVar34];
          local_d0 = local_d0 + (local_a8 <= puVar26);
          local_a8 = local_a8 + (ulong)(local_a8 <= puVar26) * 0x20;
          puVar20 = (ulong *)(local_d0 + (long)puVar26);
          iVar24 = 0x11;
          puVar39 = puVar26;
          UVar29 = UVar31;
          if (puVar20 <= puVar18) {
            local_134 = (int)puVar26 - iVar37;
            iVar24 = 0;
            local_90 = uVar34;
          }
        }
        else {
          puVar26 = (ulong *)((long)puVar39 + 1);
          puVar40 = iEnd;
          if (uVar27 < uVar4) {
            puVar40 = mEnd;
          }
          sVar19 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar39 + 5),(BYTE *)(piVar33 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar40,iStart);
          uVar34 = (long)puVar26 - (long)src;
          puVar39 = (ulong *)seqStore->lit;
          if (puVar1 < puVar26) {
            ZSTD_safecopyLiterals((BYTE *)puVar39,(BYTE *)src,(BYTE *)puVar26,(BYTE *)puVar1);
          }
          else {
            uVar44 = *(ulong *)((long)src + 8);
            *puVar39 = *src;
            puVar39[1] = uVar44;
            if (0x10 < uVar34) {
              pBVar43 = seqStore->lit;
              uVar44 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar43 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar43 + 0x18) = uVar44;
              if (0x20 < (long)uVar34) {
                lVar28 = 0;
                do {
                  puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
                  uVar15 = puVar3[1];
                  pBVar21 = pBVar43 + lVar28 + 0x20;
                  *(undefined8 *)pBVar21 = *puVar3;
                  *(undefined8 *)(pBVar21 + 8) = uVar15;
                  puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
                  uVar15 = puVar3[1];
                  *(undefined8 *)(pBVar21 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar21 + 0x18) = uVar15;
                  lVar28 = lVar28 + 0x20;
                } while (pBVar21 + 0x20 < pBVar43 + uVar34);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar34;
          if (0xffff < uVar34) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          psVar11 = seqStore->sequences;
          psVar11->litLength = (U16)uVar34;
          psVar11->offBase = 1;
          if (0xffff < sVar19 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
          }
          pBVar43 = (BYTE *)(sVar19 + 4);
          psVar11->mlBase = (U16)(sVar19 + 1);
          seqStore->sequences = psVar11 + 1;
          iVar24 = 0xc;
          puVar39 = puVar26;
          UVar29 = UVar31;
        }
LAB_003abe01:
        UVar31 = UVar29;
        puVar26 = puVar20;
      } while (iVar24 == 0);
      if (iVar24 == 0xc) {
        puVar39 = (ulong *)((long)puVar39 + (long)pBVar43);
        if (puVar39 <= puVar18) {
          pUVar10[(ulong)(*(long *)(pBVar6 + (ulong)local_134 + 2) * -0x30e4432340650000) >>
                  (bVar23 & 0x3f)] = local_134 + 2;
          pUVar10[(ulong)(*(long *)((long)puVar39 + -2) * -0x30e4432340650000) >> (bVar23 & 0x3f)] =
               ((int)puVar39 + -2) - iVar37;
          do {
            if (puVar18 < puVar39) break;
            UVar29 = (int)puVar39 - iVar37;
            uVar17 = UVar29 - UVar25;
            pBVar21 = pBVar6;
            if (uVar17 < uVar4) {
              pBVar21 = pBVar8 + -(ulong)uVar30;
            }
            if (((uVar4 - 1) - uVar17 < 3) || (*(int *)(pBVar21 + uVar17) != (int)*puVar39)) {
              bVar45 = false;
              UVar29 = UVar25;
            }
            else {
              puVar20 = iEnd;
              if (uVar17 < uVar4) {
                puVar20 = mEnd;
              }
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar39 + 4),(BYTE *)((long)(pBVar21 + uVar17) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar20,iStart);
              puVar20 = (ulong *)seqStore->lit;
              if (puVar1 < puVar39) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar20,(BYTE *)puVar39,(BYTE *)puVar39,(BYTE *)puVar1);
              }
              else {
                uVar34 = puVar39[1];
                *puVar20 = *puVar39;
                puVar20[1] = uVar34;
              }
              psVar11 = seqStore->sequences;
              psVar11->litLength = 0;
              psVar11->offBase = 1;
              if (0xffff < sVar19 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar11->mlBase = (U16)(sVar19 + 1);
              seqStore->sequences = psVar11 + 1;
              pUVar10[*puVar39 * -0x30e4432340650000 >> (bVar23 & 0x3f)] = UVar29;
              puVar39 = (ulong *)((long)puVar39 + sVar19 + 4);
              bVar45 = true;
              UVar29 = UVar31;
              UVar31 = UVar25;
            }
            UVar25 = UVar29;
          } while (bVar45);
        }
        puVar20 = (ulong *)(uVar36 + (long)puVar39);
        bVar45 = true;
        src = puVar39;
      }
      else {
        bVar45 = false;
      }
    } while (bVar45);
  }
  else if (uVar27 == 7) {
    if ((iVar24 != 0) && (uVar17 < 0x3e)) {
      uVar34 = 0;
      do {
        uVar34 = uVar34 + 0x40;
      } while (uVar34 < (ulong)(4L << (bVar22 & 0x3f)));
    }
    puVar39 = (ulong *)((long)src + (ulong)(iVar13 == iVar14));
    bVar23 = 0x40 - cVar16;
    puVar1 = iEnd + -4;
    pBVar43 = pBVar42;
    do {
      if (puVar18 < puVar20) break;
      local_90 = *puVar39 * -0x30e44323405a9d00 >> (bVar23 & 0x3f);
      uVar34 = *puVar39 * -0x30e44323405a9d00 >> (0x38 - bVar22 & 0x3f);
      uVar17 = pUVar9[uVar34 >> 8];
      bVar45 = (char)uVar17 == (char)uVar34;
      local_144 = pUVar10[local_90];
      local_134 = (int)puVar39 - iVar37;
      local_a8 = puVar39 + 0x20;
      puVar26 = puVar20;
      local_d0 = uVar36;
      do {
        uVar27 = (local_134 - UVar31) + 1;
        piVar33 = (int *)(pBVar6 + uVar27);
        if (uVar27 < uVar4) {
          piVar33 = (int *)(pBVar8 + (uVar27 - uVar30));
        }
        uVar34 = *puVar26 * -0x30e44323405a9d00 >> (bVar23 & 0x3f);
        uVar44 = *puVar26 * -0x30e44323405a9d00 >> (0x38 - bVar22 & 0x3f);
        pUVar10[local_90] = local_134;
        puVar20 = puVar26;
        if (((uVar4 - 1) - uVar27 < 3) || (*piVar33 != *(int *)((long)puVar39 + 1))) {
          if (bVar45) {
            uVar27 = uVar17 >> 8;
            iVar24 = 0;
            bVar12 = true;
            if (((uVar5 < uVar27) && (*(int *)(pBVar8 + uVar27) == (int)*puVar39)) &&
               (local_144 <= uVar4)) {
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar39 + 4),(BYTE *)((long)(pBVar8 + uVar27) + 4),
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              pBVar43 = (BYTE *)(sVar19 + 4);
              if (src < puVar39) {
                pBVar21 = pBVar8 + ((ulong)uVar27 - 1);
                do {
                  puVar40 = (ulong *)((long)puVar39 + -1);
                  if ((*(BYTE *)puVar40 != *pBVar21) ||
                     (pBVar43 = pBVar43 + 1, puVar39 = puVar40, puVar40 <= src)) break;
                  bVar12 = pBVar42 < pBVar21;
                  pBVar21 = pBVar21 + -1;
                } while (bVar12);
              }
              uVar41 = (long)puVar39 - (long)src;
              puVar40 = (ulong *)seqStore->lit;
              if (puVar1 < puVar39) {
                ZSTD_safecopyLiterals((BYTE *)puVar40,(BYTE *)src,(BYTE *)puVar39,(BYTE *)puVar1);
              }
              else {
                uVar35 = *(ulong *)((long)src + 8);
                *puVar40 = *src;
                puVar40[1] = uVar35;
                if (0x10 < uVar41) {
                  pBVar21 = seqStore->lit;
                  uVar35 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar21 + 0x18) = uVar35;
                  if (0x20 < (long)uVar41) {
                    lVar28 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
                      uVar15 = puVar3[1];
                      pBVar2 = pBVar21 + lVar28 + 0x20;
                      *(undefined8 *)pBVar2 = *puVar3;
                      *(undefined8 *)(pBVar2 + 8) = uVar15;
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
                      uVar15 = puVar3[1];
                      *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                      lVar28 = lVar28 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar41);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar41;
              if (0xffff < uVar41) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              UVar29 = local_134 - (uVar27 + uVar30);
              psVar11 = seqStore->sequences;
              psVar11->litLength = (U16)uVar41;
              psVar11->offBase = UVar29 + 3;
              if ((BYTE *)0xffff < pBVar43 + -3) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar11->mlBase = (U16)(pBVar43 + -3);
              seqStore->sequences = psVar11 + 1;
              iVar24 = 0xc;
              bVar12 = false;
              UVar25 = UVar31;
              UVar31 = UVar29;
            }
            UVar29 = UVar31;
            if (!bVar12) goto LAB_003ab43d;
          }
          if (uVar4 < local_144) {
            piVar33 = (int *)(pBVar6 + local_144);
            if (*piVar33 == (int)*puVar39) {
              puVar26 = (ulong *)((long)puVar39 + 4);
              puVar32 = (ulong *)(piVar33 + 1);
              puVar40 = puVar26;
              if (puVar26 < (ulong *)((long)iEnd - 7U)) {
                uVar44 = *puVar26 ^ *puVar32;
                uVar34 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                pBVar43 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                if (*puVar32 == *puVar26) {
                  puVar40 = (ulong *)((long)puVar39 + 0xc);
                  puVar32 = (ulong *)(piVar33 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar40) goto LAB_003ab29f;
                    uVar34 = *puVar32;
                    uVar44 = *puVar40;
                    uVar35 = uVar44 ^ uVar34;
                    uVar41 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                      }
                    }
                    pBVar43 = (BYTE *)((long)puVar40 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar26))
                    ;
                    puVar40 = puVar40 + 1;
                    puVar32 = puVar32 + 1;
                  } while (uVar34 == uVar44);
                }
              }
              else {
LAB_003ab29f:
                if ((puVar40 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar32 == (int)*puVar40)) {
                  puVar40 = (ulong *)((long)puVar40 + 4);
                  puVar32 = (ulong *)((long)puVar32 + 4);
                }
                if ((puVar40 < (ulong *)((long)iEnd + -1)) && ((short)*puVar32 == (short)*puVar40))
                {
                  puVar40 = (ulong *)((long)puVar40 + 2);
                  puVar32 = (ulong *)((long)puVar32 + 2);
                }
                if (puVar40 < iEnd) {
                  puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar40));
                }
                pBVar43 = (BYTE *)((long)puVar40 - (long)puVar26);
              }
              pBVar43 = pBVar43 + 4;
              puVar26 = puVar39;
              if (src < puVar39) {
                pBVar21 = pBVar6 + ((ulong)local_144 - 1);
                do {
                  puVar40 = (ulong *)((long)puVar26 + -1);
                  if ((*(BYTE *)puVar40 != *pBVar21) ||
                     (pBVar43 = pBVar43 + 1, puVar26 = puVar40, puVar40 <= src)) break;
                  bVar12 = iStart < pBVar21;
                  pBVar21 = pBVar21 + -1;
                } while (bVar12);
              }
              uVar34 = (long)puVar26 - (long)src;
              puVar40 = (ulong *)seqStore->lit;
              if (puVar1 < puVar26) {
                ZSTD_safecopyLiterals((BYTE *)puVar40,(BYTE *)src,(BYTE *)puVar26,(BYTE *)puVar1);
              }
              else {
                uVar44 = *(ulong *)((long)src + 8);
                *puVar40 = *src;
                puVar40[1] = uVar44;
                if (0x10 < uVar34) {
                  pBVar21 = seqStore->lit;
                  uVar44 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar21 + 0x18) = uVar44;
                  if (0x20 < (long)uVar34) {
                    lVar28 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
                      uVar15 = puVar3[1];
                      pBVar2 = pBVar21 + lVar28 + 0x20;
                      *(undefined8 *)pBVar2 = *puVar3;
                      *(undefined8 *)(pBVar2 + 8) = uVar15;
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
                      uVar15 = puVar3[1];
                      *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                      lVar28 = lVar28 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar34);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar34;
              if (0xffff < uVar34) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              UVar29 = (int)puVar39 - (int)piVar33;
              psVar11 = seqStore->sequences;
              psVar11->litLength = (U16)uVar34;
              psVar11->offBase = UVar29 + 3;
              if ((BYTE *)0xffff < pBVar43 + -3) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar11->mlBase = (U16)(pBVar43 + -3);
              seqStore->sequences = psVar11 + 1;
              iVar24 = 0xc;
              puVar39 = puVar26;
              UVar25 = UVar31;
              goto LAB_003ab43d;
            }
          }
          uVar17 = pUVar9[uVar44 >> 8];
          bVar45 = (char)uVar44 == (char)uVar17;
          local_144 = pUVar10[uVar34];
          local_d0 = local_d0 + (local_a8 <= puVar26);
          local_a8 = local_a8 + (ulong)(local_a8 <= puVar26) * 0x20;
          puVar20 = (ulong *)(local_d0 + (long)puVar26);
          iVar24 = 0x11;
          puVar39 = puVar26;
          UVar29 = UVar31;
          if (puVar20 <= puVar18) {
            local_134 = (int)puVar26 - iVar37;
            iVar24 = 0;
            local_90 = uVar34;
          }
        }
        else {
          puVar26 = (ulong *)((long)puVar39 + 1);
          puVar40 = iEnd;
          if (uVar27 < uVar4) {
            puVar40 = mEnd;
          }
          sVar19 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar39 + 5),(BYTE *)(piVar33 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar40,iStart);
          uVar34 = (long)puVar26 - (long)src;
          puVar39 = (ulong *)seqStore->lit;
          if (puVar1 < puVar26) {
            ZSTD_safecopyLiterals((BYTE *)puVar39,(BYTE *)src,(BYTE *)puVar26,(BYTE *)puVar1);
          }
          else {
            uVar44 = *(ulong *)((long)src + 8);
            *puVar39 = *src;
            puVar39[1] = uVar44;
            if (0x10 < uVar34) {
              pBVar43 = seqStore->lit;
              uVar44 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar43 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar43 + 0x18) = uVar44;
              if (0x20 < (long)uVar34) {
                lVar28 = 0;
                do {
                  puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
                  uVar15 = puVar3[1];
                  pBVar21 = pBVar43 + lVar28 + 0x20;
                  *(undefined8 *)pBVar21 = *puVar3;
                  *(undefined8 *)(pBVar21 + 8) = uVar15;
                  puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
                  uVar15 = puVar3[1];
                  *(undefined8 *)(pBVar21 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar21 + 0x18) = uVar15;
                  lVar28 = lVar28 + 0x20;
                } while (pBVar21 + 0x20 < pBVar43 + uVar34);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar34;
          if (0xffff < uVar34) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          psVar11 = seqStore->sequences;
          psVar11->litLength = (U16)uVar34;
          psVar11->offBase = 1;
          if (0xffff < sVar19 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
          }
          pBVar43 = (BYTE *)(sVar19 + 4);
          psVar11->mlBase = (U16)(sVar19 + 1);
          seqStore->sequences = psVar11 + 1;
          iVar24 = 0xc;
          puVar39 = puVar26;
          UVar29 = UVar31;
        }
LAB_003ab43d:
        UVar31 = UVar29;
        puVar26 = puVar20;
      } while (iVar24 == 0);
      if (iVar24 == 0xc) {
        src = (void *)((long)puVar39 + (long)pBVar43);
        if (src <= puVar18) {
          pUVar10[(ulong)(*(long *)(pBVar6 + (ulong)local_134 + 2) * -0x30e44323405a9d00) >>
                  (bVar23 & 0x3f)] = local_134 + 2;
          pUVar10[(ulong)(*(long *)((long)src + -2) * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] =
               ((int)src + -2) - iVar37;
          do {
            if (puVar18 < src) break;
            UVar29 = (int)src - iVar37;
            uVar17 = UVar29 - UVar25;
            pBVar21 = pBVar6;
            if (uVar17 < uVar4) {
              pBVar21 = pBVar8 + -(ulong)uVar30;
            }
            if (((uVar4 - 1) - uVar17 < 3) || (*(int *)(pBVar21 + uVar17) != (int)*src)) {
              bVar45 = false;
              UVar29 = UVar25;
            }
            else {
              puVar20 = iEnd;
              if (uVar17 < uVar4) {
                puVar20 = mEnd;
              }
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar21 + uVar17) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar20,iStart);
              puVar20 = (ulong *)seqStore->lit;
              if (puVar1 < src) {
                ZSTD_safecopyLiterals((BYTE *)puVar20,(BYTE *)src,(BYTE *)src,(BYTE *)puVar1);
              }
              else {
                uVar34 = *(ulong *)((long)src + 8);
                *puVar20 = *src;
                puVar20[1] = uVar34;
              }
              psVar11 = seqStore->sequences;
              psVar11->litLength = 0;
              psVar11->offBase = 1;
              if (0xffff < sVar19 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar11->mlBase = (U16)(sVar19 + 1);
              seqStore->sequences = psVar11 + 1;
              pUVar10[*src * -0x30e44323405a9d00 >> (bVar23 & 0x3f)] = UVar29;
              src = (void *)((long)src + sVar19 + 4);
              bVar45 = true;
              UVar29 = UVar31;
              UVar31 = UVar25;
            }
            UVar25 = UVar29;
          } while (bVar45);
        }
        puVar20 = (ulong *)(uVar36 + (long)src);
        bVar45 = true;
        puVar39 = (ulong *)src;
      }
      else {
        bVar45 = false;
      }
    } while (bVar45);
  }
  else {
    if ((iVar24 != 0) && (uVar17 < 0x3e)) {
      uVar34 = 0;
      do {
        uVar34 = uVar34 + 0x40;
      } while (uVar34 < (ulong)(4L << (bVar22 & 0x3f)));
    }
    puVar39 = (ulong *)((long)src + (ulong)(iVar13 == iVar14));
    bVar23 = 0x20 - cVar16;
    puVar1 = iEnd + -4;
    pBVar43 = pBVar42;
    do {
      if (puVar18 < puVar20) break;
      uVar27 = (int)*puVar39 * -0x61c8864f;
      local_90 = (ulong)(uVar27 >> (bVar23 & 0x1f));
      uVar27 = uVar27 >> (0x18 - bVar22 & 0x1f);
      uVar17 = pUVar9[uVar27 >> 8];
      bVar45 = (char)uVar17 == (char)uVar27;
      local_144 = pUVar10[local_90];
      local_134 = (int)puVar39 - iVar37;
      local_a0 = puVar39 + 0x20;
      puVar26 = puVar20;
      puVar40 = puVar39;
      local_a8 = (ulong *)uVar36;
      do {
        uVar27 = (local_134 - UVar31) + 1;
        piVar33 = (int *)(pBVar6 + uVar27);
        if (uVar27 < uVar4) {
          piVar33 = (int *)(pBVar8 + (uVar27 - uVar30));
        }
        uVar38 = (int)*puVar26 * -0x61c8864f;
        uVar34 = (ulong)(uVar38 >> (bVar23 & 0x1f));
        uVar38 = uVar38 >> (0x18 - bVar22 & 0x1f);
        pUVar10[local_90] = local_134;
        puVar20 = puVar26;
        if (((uVar4 - 1) - uVar27 < 3) || (*piVar33 != *(int *)((long)puVar40 + 1))) {
          if (bVar45) {
            uVar27 = uVar17 >> 8;
            iVar24 = 0;
            bVar12 = true;
            puVar39 = puVar40;
            UVar29 = UVar31;
            if (((uVar5 < uVar27) && (*(int *)(pBVar8 + uVar27) == (int)*puVar40)) &&
               (local_144 <= uVar4)) {
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar40 + 4),(BYTE *)((long)(pBVar8 + uVar27) + 4),
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              pBVar43 = (BYTE *)(sVar19 + 4);
              if (src < puVar40) {
                pBVar21 = pBVar8 + ((ulong)uVar27 - 1);
                do {
                  puVar39 = (ulong *)((long)puVar40 + -1);
                  if ((*(BYTE *)puVar39 != *pBVar21) ||
                     (pBVar43 = pBVar43 + 1, puVar40 = puVar39, puVar39 <= src)) break;
                  bVar12 = pBVar42 < pBVar21;
                  pBVar21 = pBVar21 + -1;
                } while (bVar12);
              }
              uVar44 = (long)puVar40 - (long)src;
              puVar39 = (ulong *)seqStore->lit;
              if (puVar1 < puVar40) {
                ZSTD_safecopyLiterals((BYTE *)puVar39,(BYTE *)src,(BYTE *)puVar40,(BYTE *)puVar1);
              }
              else {
                uVar41 = *(ulong *)((long)src + 8);
                *puVar39 = *src;
                puVar39[1] = uVar41;
                if (0x10 < uVar44) {
                  pBVar21 = seqStore->lit;
                  uVar41 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar21 + 0x18) = uVar41;
                  if (0x20 < (long)uVar44) {
                    lVar28 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
                      uVar15 = puVar3[1];
                      pBVar2 = pBVar21 + lVar28 + 0x20;
                      *(undefined8 *)pBVar2 = *puVar3;
                      *(undefined8 *)(pBVar2 + 8) = uVar15;
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
                      uVar15 = puVar3[1];
                      *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                      lVar28 = lVar28 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar44);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar44;
              if (0xffff < uVar44) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              UVar29 = local_134 - (uVar27 + uVar30);
              psVar11 = seqStore->sequences;
              psVar11->litLength = (U16)uVar44;
              psVar11->offBase = UVar29 + 3;
              if ((BYTE *)0xffff < pBVar43 + -3) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar11->mlBase = (U16)(pBVar43 + -3);
              seqStore->sequences = psVar11 + 1;
              iVar24 = 0xc;
              bVar12 = false;
              puVar39 = puVar40;
              UVar25 = UVar31;
            }
            puVar40 = puVar39;
            UVar31 = UVar29;
            if (!bVar12) goto LAB_003ad13f;
          }
          if (uVar4 < local_144) {
            piVar33 = (int *)(pBVar6 + local_144);
            if (*piVar33 == (int)*puVar40) {
              puVar39 = (ulong *)((long)puVar40 + 4);
              puVar32 = (ulong *)(piVar33 + 1);
              puVar26 = puVar39;
              if (puVar39 < (ulong *)((long)iEnd + -7)) {
                uVar44 = *puVar39 ^ *puVar32;
                uVar34 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                pBVar43 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                if (*puVar32 == *puVar39) {
                  puVar26 = (ulong *)((long)puVar40 + 0xc);
                  puVar32 = (ulong *)(piVar33 + 3);
                  do {
                    if ((ulong *)((long)iEnd + -7) <= puVar26) goto LAB_003acfa8;
                    uVar34 = *puVar32;
                    uVar44 = *puVar26;
                    uVar35 = uVar44 ^ uVar34;
                    uVar41 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                      }
                    }
                    pBVar43 = (BYTE *)((long)puVar26 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar39))
                    ;
                    puVar26 = puVar26 + 1;
                    puVar32 = puVar32 + 1;
                  } while (uVar34 == uVar44);
                }
              }
              else {
LAB_003acfa8:
                if ((puVar26 < (ulong *)((long)iEnd + -3)) && ((int)*puVar32 == (int)*puVar26)) {
                  puVar26 = (ulong *)((long)puVar26 + 4);
                  puVar32 = (ulong *)((long)puVar32 + 4);
                }
                if ((puVar26 < (ulong *)((long)iEnd + -1)) && ((short)*puVar32 == (short)*puVar26))
                {
                  puVar26 = (ulong *)((long)puVar26 + 2);
                  puVar32 = (ulong *)((long)puVar32 + 2);
                }
                if (puVar26 < iEnd) {
                  puVar26 = (ulong *)((long)puVar26 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar26));
                }
                pBVar43 = (BYTE *)((long)puVar26 - (long)puVar39);
              }
              pBVar43 = pBVar43 + 4;
              puVar39 = puVar40;
              if (src < puVar40) {
                pBVar21 = pBVar6 + ((ulong)local_144 - 1);
                do {
                  puVar26 = (ulong *)((long)puVar39 + -1);
                  if ((*(BYTE *)puVar26 != *pBVar21) ||
                     (pBVar43 = pBVar43 + 1, puVar39 = puVar26, puVar26 <= src)) break;
                  bVar12 = iStart < pBVar21;
                  pBVar21 = pBVar21 + -1;
                } while (bVar12);
              }
              uVar34 = (long)puVar39 - (long)src;
              puVar26 = (ulong *)seqStore->lit;
              if (puVar1 < puVar39) {
                ZSTD_safecopyLiterals((BYTE *)puVar26,(BYTE *)src,(BYTE *)puVar39,(BYTE *)puVar1);
              }
              else {
                uVar44 = *(ulong *)((long)src + 8);
                *puVar26 = *src;
                puVar26[1] = uVar44;
                if (0x10 < uVar34) {
                  pBVar21 = seqStore->lit;
                  uVar44 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar21 + 0x18) = uVar44;
                  if (0x20 < (long)uVar34) {
                    lVar28 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
                      uVar15 = puVar3[1];
                      pBVar2 = pBVar21 + lVar28 + 0x20;
                      *(undefined8 *)pBVar2 = *puVar3;
                      *(undefined8 *)(pBVar2 + 8) = uVar15;
                      puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
                      uVar15 = puVar3[1];
                      *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                      lVar28 = lVar28 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar34);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar34;
              if (0xffff < uVar34) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              UVar29 = (int)puVar40 - (int)piVar33;
              psVar11 = seqStore->sequences;
              psVar11->litLength = (U16)uVar34;
              psVar11->offBase = UVar29 + 3;
              if ((BYTE *)0xffff < pBVar43 + -3) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar11->mlBase = (U16)(pBVar43 + -3);
              seqStore->sequences = psVar11 + 1;
              iVar24 = 0xc;
              UVar25 = UVar31;
              UVar31 = UVar29;
              goto LAB_003ad13f;
            }
          }
          uVar17 = pUVar9[uVar38 >> 8];
          bVar45 = (char)uVar38 == (char)uVar17;
          local_144 = pUVar10[uVar34];
          local_a8 = (ulong *)((long)local_a8 + (ulong)(local_a0 <= puVar26));
          local_a0 = local_a0 + (ulong)(local_a0 <= puVar26) * 0x20;
          puVar20 = (ulong *)((long)puVar26 + (long)local_a8);
          iVar24 = 0x11;
          puVar39 = puVar26;
          if (puVar20 <= puVar18) {
            local_134 = (int)puVar26 - iVar37;
            iVar24 = 0;
            local_90 = uVar34;
          }
        }
        else {
          puVar39 = (ulong *)((long)puVar40 + 1);
          puVar26 = iEnd;
          if (uVar27 < uVar4) {
            puVar26 = mEnd;
          }
          sVar19 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar40 + 5),(BYTE *)(piVar33 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar26,iStart);
          uVar34 = (long)puVar39 - (long)src;
          puVar26 = (ulong *)seqStore->lit;
          if (puVar1 < puVar39) {
            ZSTD_safecopyLiterals((BYTE *)puVar26,(BYTE *)src,(BYTE *)puVar39,(BYTE *)puVar1);
          }
          else {
            uVar44 = *(ulong *)((long)src + 8);
            *puVar26 = *src;
            puVar26[1] = uVar44;
            if (0x10 < uVar34) {
              pBVar43 = seqStore->lit;
              uVar44 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar43 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar43 + 0x18) = uVar44;
              if (0x20 < (long)uVar34) {
                lVar28 = 0;
                do {
                  puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
                  uVar15 = puVar3[1];
                  pBVar21 = pBVar43 + lVar28 + 0x20;
                  *(undefined8 *)pBVar21 = *puVar3;
                  *(undefined8 *)(pBVar21 + 8) = uVar15;
                  puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
                  uVar15 = puVar3[1];
                  *(undefined8 *)(pBVar21 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar21 + 0x18) = uVar15;
                  lVar28 = lVar28 + 0x20;
                } while (pBVar21 + 0x20 < pBVar43 + uVar34);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar34;
          if (0xffff < uVar34) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          psVar11 = seqStore->sequences;
          psVar11->litLength = (U16)uVar34;
          psVar11->offBase = 1;
          if (0xffff < sVar19 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
          }
          pBVar43 = (BYTE *)(sVar19 + 4);
          psVar11->mlBase = (U16)(sVar19 + 1);
          seqStore->sequences = psVar11 + 1;
          iVar24 = 0xc;
        }
LAB_003ad13f:
        puVar26 = puVar20;
        puVar40 = puVar39;
      } while (iVar24 == 0);
      if (iVar24 == 0xc) {
        puVar39 = (ulong *)((long)puVar39 + (long)pBVar43);
        if (puVar39 <= puVar18) {
          pUVar10[(uint)(*(int *)(pBVar6 + (ulong)local_134 + 2) * -0x61c8864f) >> (bVar23 & 0x1f)]
               = local_134 + 2;
          pUVar10[(uint)(*(int *)((long)puVar39 + -2) * -0x61c8864f) >> (bVar23 & 0x1f)] =
               ((int)puVar39 + -2) - iVar37;
          do {
            if (puVar18 < puVar39) break;
            UVar29 = (int)puVar39 - iVar37;
            uVar17 = UVar29 - UVar25;
            pBVar21 = pBVar6;
            if (uVar17 < uVar4) {
              pBVar21 = pBVar8 + -(ulong)uVar30;
            }
            if (((uVar4 - 1) - uVar17 < 3) || (*(int *)(pBVar21 + uVar17) != (int)*puVar39)) {
              bVar45 = false;
              UVar29 = UVar25;
            }
            else {
              puVar20 = iEnd;
              if (uVar17 < uVar4) {
                puVar20 = mEnd;
              }
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar39 + 4),(BYTE *)((long)(pBVar21 + uVar17) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar20,iStart);
              puVar20 = (ulong *)seqStore->lit;
              if (puVar1 < puVar39) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar20,(BYTE *)puVar39,(BYTE *)puVar39,(BYTE *)puVar1);
              }
              else {
                uVar34 = puVar39[1];
                *puVar20 = *puVar39;
                puVar20[1] = uVar34;
              }
              psVar11 = seqStore->sequences;
              psVar11->litLength = 0;
              psVar11->offBase = 1;
              if (0xffff < sVar19 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar11->mlBase = (U16)(sVar19 + 1);
              seqStore->sequences = psVar11 + 1;
              pUVar10[(uint)((int)*puVar39 * -0x61c8864f) >> (bVar23 & 0x1f)] = UVar29;
              puVar39 = (ulong *)((long)puVar39 + sVar19 + 4);
              bVar45 = true;
              UVar29 = UVar31;
              UVar31 = UVar25;
            }
            UVar25 = UVar29;
          } while (bVar45);
        }
        puVar20 = (ulong *)(uVar36 + (long)puVar39);
        bVar45 = true;
        src = puVar39;
      }
      else {
        bVar45 = false;
      }
    } while (bVar45);
  }
  *rep = UVar31;
  rep[1] = UVar25;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_4_0(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_5_0(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_6_0(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_7_0(ms, seqStore, rep, src, srcSize);
    }
}